

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O2

ExprPtr __thiscall mathiu::impl::operator+(impl *this,ExprPtr *lhs,ExprPtr *rhs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Expr *value;
  Expr *value_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  impl *piVar6;
  ExprPtr *pEVar7;
  bool bVar8;
  enable_if_t<isTupleLikeV<std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>_>,_bool>
  eVar9;
  Sum *pSVar10;
  Sum *c2;
  int *piVar11;
  vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  *pvVar12;
  shared_ptr<const_mathiu::impl::Expr> *psVar13;
  shared_ptr<const_mathiu::impl::Expr> *rhs_00;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  *patterns_1;
  IdProcess extraout_EDX;
  IdProcess extraout_EDX_00;
  IdProcess IVar14;
  IdProcess extraout_EDX_01;
  IdProcess extraout_EDX_02;
  IdProcess extraout_EDX_03;
  IdProcess extraout_EDX_04;
  IdProcess extraout_EDX_05;
  IdProcess extraout_EDX_06;
  IdProcess extraout_EDX_07;
  IdProcess extraout_EDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar15;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *p_Var16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:110:28)>
  f;
  ExprPtr EVar17;
  initializer_list<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  __l;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> local_2248;
  allocator_type local_2232;
  ExprPtrLess local_2231;
  pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_2230 [2];
  undefined1 local_21f0 [48];
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_21c0;
  impl *local_21a0;
  Id<int> iir;
  undefined1 local_2178 [16];
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_2168;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *local_2140;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_2138;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *local_2110;
  Id<int> ii4;
  Id<int> ii3;
  Id<int> ii2;
  Id<int> ii1;
  Id<int> iil;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> rest;
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_2040;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> coeff2;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> coeff1;
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_1fd0;
  Id<mathiu::impl::PieceWise> *local_1f80;
  ExprPtr *local_1f78;
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_1f70;
  Id<mathiu::impl::PieceWise> *local_1f20;
  ExprPtr *local_1f18;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_1f10;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_1ee0;
  Id<mathiu::impl::PieceWise> iPieceWise;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_1e80;
  Id<mathiu::impl::Sum> *local_1e18;
  ExprPtr *local_1e10;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_1e08;
  Id<mathiu::impl::Sum> *local_1da0;
  ExprPtr *local_1d98;
  Id<mathiu::impl::Sum> iSr;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  local_1d48;
  Id<int> *local_1c88;
  Id<int> *local_1c80;
  Id<int> *local_1c78;
  Id<int> *local_1c70;
  Id<int> local_1c68;
  Id<int> local_1c48;
  Id<int> local_1c28;
  Id<int> local_1c08;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  local_1be8;
  Id<int> *local_1b48;
  Id<int> *local_1b40;
  Id<int> *local_1b38;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  local_1b30;
  Id<int> *local_1a90;
  Id<int> *local_1a88;
  Id<int> *local_1a80;
  ContextT context;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  local_1520;
  Id<int> *local_14a0;
  Id<int> *local_1498;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_1490;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_1448;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_1400;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_13b8;
  Id<mathiu::impl::Sum> iSl;
  _Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  local_1328;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> *local_1278;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> *local_1270;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> *local_1268;
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_1260;
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_1210;
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_11c0;
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_1170;
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_1120;
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_10d0;
  App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_1080;
  App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_1028;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  local_fd0;
  Id<mathiu::impl::Sum> *local_f00;
  Id<mathiu::impl::Sum> *local_ef8;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_ef0;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_e88;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_e20;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_db8;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_d50;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_ce8;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_c80;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_c18;
  _Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_> local_bb0;
  _Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_> local_b70;
  undefined1 local_b30 [128];
  _Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_> local_ab0;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
  local_a70;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
  local_a30;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
  local_9f0;
  _Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  local_9b0;
  _Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  local_900;
  App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
  local_850;
  App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
  local_7f0;
  App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
  local_790;
  App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
  local_730;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  local_6d0;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  local_600;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  local_530;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  local_4b0;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  local_430;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  local_390;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  local_2f0;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  local_250;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  local_1b0;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  local_f0;
  
  local_21a0 = this;
  matchit::impl::Id<mathiu::impl::Sum>::Id(&iSl);
  matchit::impl::Id<mathiu::impl::Sum>::Id(&iSr);
  iil.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  iil.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _4_8_ = ZEXT48((uint)context.mMemHolder._M_elems[0].
                       super__Variant_base<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Move_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       ._M_u._0_4_);
  iil.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _12_8_ = 0;
  iil.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _20_4_ = 0;
  iil.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_index
       = '\0';
  iir.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  iir.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _4_8_ = ZEXT48((uint)context.mMemHolder._M_elems[0].
                       super__Variant_base<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Move_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       ._M_u._0_4_);
  iir.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _12_8_ = 0;
  iir.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _20_4_ = 0;
  iir.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_index
       = '\0';
  ii1.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  ii1.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _4_8_ = ZEXT48((uint)context.mMemHolder._M_elems[0].
                       super__Variant_base<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Move_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       ._M_u._0_4_);
  ii1.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _12_8_ = 0;
  ii1.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _20_4_ = 0;
  ii1.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_index
       = '\0';
  ii2.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  ii2.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _4_8_ = ZEXT48((uint)context.mMemHolder._M_elems[0].
                       super__Variant_base<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Move_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       ._M_u._0_4_);
  ii2.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _12_8_ = 0;
  ii2.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _20_4_ = 0;
  ii3.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  ii2.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_index
       = '\0';
  ii3.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _4_8_ = ZEXT48((uint)context.mMemHolder._M_elems[0].
                       super__Variant_base<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Move_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       ._M_u._0_4_);
  ii3.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _12_8_ = 0;
  ii3.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _20_4_ = 0;
  ii3.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_index
       = '\0';
  context.mMemHolder._M_elems[0].
  super__Variant_base<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ._M_u._4_4_ = 0;
  context.mMemHolder._M_elems[0].
  super__Variant_base<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ._M_u._8_4_ = 0;
  context.mMemHolder._M_elems[0].
  super__Variant_base<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ._M_u._12_4_ = 0;
  context.mMemHolder._M_elems[0].
  super__Variant_base<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ._M_u._16_4_ = 0;
  ii4.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  ii4.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _4_8_ = ZEXT48((uint)context.mMemHolder._M_elems[0].
                       super__Variant_base<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Move_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       ._M_u._0_4_);
  ii4.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _12_8_ = 0;
  ii4.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _20_4_ = 0;
  ii4.mBlock.super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_index
       = '\0';
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id(&coeff1);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id(&coeff2);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id(&rest);
  matchit::impl::Id<mathiu::impl::PieceWise>::Id(&iPieceWise);
  value = (lhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  value_00 = (rhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_2138.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  patterns_1 = (App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
                *)&matchit::impl::deref;
  local_2138.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_2138.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mPattern = 0;
  local_2138.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_2138.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_2168.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  local_2168.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_2168.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mPattern = 0;
  local_2168.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_2168.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_2140 = &lhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
  local_2110 = &rhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
  matchit::impl::Id<mathiu::impl::Sum>::Id((Id<mathiu::impl::Sum> *)&local_13b8,&iSl);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            (&local_c18,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,
             (Id<mathiu::impl::Sum> *)&local_13b8);
  matchit::impl::Id<mathiu::impl::Sum>::Id((Id<mathiu::impl::Sum> *)&local_1400,&iSr);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            (&local_c80,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,
             (Id<mathiu::impl::Sum> *)&local_1400);
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>>
            (&local_6d0,(impl *)&local_c18,&local_c80,patterns_1);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  ::Ds(&local_600,&local_6d0);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  ::Ds(&local_fd0,&local_600);
  local_f00 = &iSl;
  local_ef8 = &iSr;
  matchit::impl::Id<mathiu::impl::Sum>::Id((Id<mathiu::impl::Sum> *)&local_1448,&iSl);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            (&local_db8,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,
             (Id<mathiu::impl::Sum> *)&local_1448);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  ::App(&local_d50,&local_db8);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  ::App(&local_ce8,&local_d50);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  ::App(&local_1e08,&local_ce8);
  local_1da0 = &iSl;
  local_1d98 = rhs;
  matchit::impl::Id<mathiu::impl::Sum>::Id((Id<mathiu::impl::Sum> *)&local_1490,&iSr);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            (&local_ef0,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,
             (Id<mathiu::impl::Sum> *)&local_1490);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  ::App(&local_e88,&local_ef0);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  ::App(&local_e20,&local_e88);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  ::App(&local_1e80,&local_e20);
  local_1e18 = &iSr;
  local_1e10 = lhs;
  matchit::impl::Id<int>::Id(&local_1c08,&iil);
  matchit::impl::as<int>::{lambda(auto:1)#1}::operator()
            (&local_9f0,(_lambda_auto_1__1_ *)&matchit::impl::as<int>,&local_1c08);
  matchit::impl::Id<int>::Id(&local_1c28,&iir);
  matchit::impl::as<int>::{lambda(auto:1)#1}::operator()
            (&local_a30,(_lambda_auto_1__1_ *)&matchit::impl::as<int>,&local_1c28);
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>>
            (&local_530,(impl *)&local_9f0,&local_a30,
             (App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
              *)patterns_1);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  ::Ds(&local_4b0,&local_530);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  ::Ds(&local_1520,&local_4b0);
  local_14a0 = &iil;
  local_1498 = &iir;
  matchit::impl::Id<int>::Id(&local_1c48,&iil);
  matchit::impl::as<int>::{lambda(auto:1)#1}::operator()
            (&local_a70,(_lambda_auto_1__1_ *)&matchit::impl::as<int>,&local_1c48);
  std::_Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>::_Tuple_impl
            (&local_ab0,&ii1,&ii2);
  matchit::impl::as<mathiu::impl::Fraction>::{lambda(auto:1)#1}::operator()
            (&local_730,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Fraction>,
             (Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_> *)&local_ab0);
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>>
            (&local_2f0,(impl *)&local_a70,
             (App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
              *)&local_730,
             (App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
              *)patterns_1);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  ::Ds(&local_250,&local_2f0);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  ::Ds(&local_1b30,&local_250);
  local_1a90 = &iil;
  local_1a88 = &ii2;
  local_1a80 = &ii1;
  std::_Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>::_Tuple_impl
            ((_Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_> *)(local_b30 + 0x40)
             ,&ii1,&ii2);
  matchit::impl::as<mathiu::impl::Fraction>::{lambda(auto:1)#1}::operator()
            (&local_790,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Fraction>,
             (Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_> *)(local_b30 + 0x40));
  matchit::impl::Id<int>::Id(&local_1c68,&iir);
  matchit::impl::as<int>::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
              *)local_b30,(_lambda_auto_1__1_ *)&matchit::impl::as<int>,&local_1c68);
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>>
            (&local_430,(impl *)&local_790,
             (App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
              *)local_b30,
             (App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
              *)patterns_1);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  ::Ds(&local_390,&local_430);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  ::Ds(&local_1be8,&local_390);
  local_1b48 = &iir;
  local_1b40 = &ii2;
  local_1b38 = &ii1;
  std::_Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>::_Tuple_impl
            (&local_b70,&ii1,&ii2);
  matchit::impl::as<mathiu::impl::Fraction>::{lambda(auto:1)#1}::operator()
            (&local_7f0,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Fraction>,
             (Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_> *)&local_b70);
  std::_Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>::_Tuple_impl
            (&local_bb0,&ii3,&ii4);
  matchit::impl::as<mathiu::impl::Fraction>::{lambda(auto:1)#1}::operator()
            (&local_850,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Fraction>,
             (Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_> *)&local_bb0);
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>>
            (&local_1b0,(impl *)&local_7f0,&local_850,
             (App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
              *)patterns_1);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  ::Ds(&local_f0,&local_1b0);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  ::Ds(&local_1d48,&local_f0);
  local_1c88 = &ii1;
  local_1c80 = &ii4;
  local_1c78 = &ii2;
  local_1c70 = &ii3;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_1ee0,&iPieceWise);
  matchit::impl::as<mathiu::impl::PieceWise>::{lambda(auto:1)#1}::operator()
            (&local_1170,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::PieceWise>,
             (Id<mathiu::impl::PieceWise> *)&local_1ee0);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  ::App(&local_1120,&local_1170);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  ::App(&local_10d0,&local_1120);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  ::App(&local_1f70,&local_10d0);
  local_1f20 = &iPieceWise;
  local_1f18 = rhs;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_1f10,&iPieceWise);
  matchit::impl::as<mathiu::impl::PieceWise>::{lambda(auto:1)#1}::operator()
            (&local_1260,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::PieceWise>,
             (Id<mathiu::impl::PieceWise> *)&local_1f10);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  ::App(&local_1210,&local_1260);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  ::App(&local_11c0,&local_1210);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  ::App(&local_1fd0,&local_11c0);
  local_1f80 = &iPieceWise;
  local_1f78 = lhs;
  asCoeffAndRest::{lambda(auto:1&&,auto:2&&)#1}::operator()
            (&local_1028,&asCoeffAndRest,&coeff1,&rest);
  asCoeffAndRest::{lambda(auto:1&&,auto:2&&)#1}::operator()
            (&local_1080,&asCoeffAndRest,&coeff2,&rest);
  std::
  _Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  ::_Tuple_impl(&local_9b0,&local_1028,&local_1080);
  std::
  _Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  ::_Tuple_impl(&local_900,&local_9b0);
  std::
  _Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  ::_Tuple_impl(&local_1328,&local_900);
  local_2248._M_ptr = (element_type *)0x0;
  local_2248._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1278 = &coeff1;
  local_1270 = &coeff2;
  local_1268 = &rest;
  memset(&context,0,0x558);
  matchit::impl::
  Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::Context(&context);
  bVar8 = less(rhs,lhs);
  if (bVar8) {
    operator+((impl *)local_2230,rhs,lhs);
    goto LAB_00165a84;
  }
  std::
  array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
  ::~array(&context.mMemHolder);
  memset(&context,0,0x558);
  matchit::impl::
  Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::Context(&context);
  bVar8 = matchit::impl::
          matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                    (value,&local_2138,1,&context);
  p_Var16 = local_2110;
  if (bVar8) {
LAB_00165a6f:
    std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)local_2230,
               p_Var16);
  }
  else {
    std::
    array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
    ::~array(&context.mMemHolder);
    memset(&context,0,0x558);
    matchit::impl::
    Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
    ::Context(&context);
    bVar8 = matchit::impl::
            matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                      (value_00,&local_2168,1,&context);
    p_Var16 = local_2140;
    if (bVar8) goto LAB_00165a6f;
    std::
    array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
    ::~array(&context.mMemHolder);
    memset(&context,0,0x558);
    matchit::impl::
    Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
    ::Context(&context);
    bVar8 = matchit::impl::
            matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                      (value,&local_fd0.mPatterns.
                              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
                              .
                              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
                              ._M_head_impl,1,&context);
    if (bVar8) {
      bVar8 = matchit::impl::
              matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                        (value_00,(App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
                                   *)&local_fd0,1,&context);
      IVar14 = extraout_EDX_00;
    }
    else {
      bVar8 = false;
      IVar14 = extraout_EDX;
    }
    matchit::impl::
    processId<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>>>
              (&local_fd0,(uint)bVar8,IVar14);
    if (bVar8 == false) {
      std::
      array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
      ::~array(&context.mMemHolder);
      memset(&context,0,0x558);
      matchit::impl::
      Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
      ::Context(&context);
      bVar8 = matchit::impl::
              matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                        (value,&local_1e08,1,&context);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
                ((InternalPatternT<matchit::impl::Id<mathiu::impl::Sum>_> *)
                 ((long)&local_1e08.mPattern.mPatterns.
                         super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                         .
                         super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                         .
                         super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                 + 8),0,(uint)bVar8);
      if (bVar8) {
        pSVar10 = matchit::impl::Id<mathiu::impl::Sum>::get(local_1da0);
        insertSum<mathiu::impl::Sum,std::shared_ptr<mathiu::impl::Expr_const>>
                  ((impl *)local_2230,pSVar10,local_1d98);
      }
      else {
        std::
        array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
        ::~array(&context.mMemHolder);
        memset(&context,0,0x558);
        matchit::impl::
        Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
        ::Context(&context);
        bVar8 = matchit::impl::
                matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                          (value_00,&local_1e80,1,&context);
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
                  ((InternalPatternT<matchit::impl::Id<mathiu::impl::Sum>_> *)
                   ((long)&local_1e80.mPattern.mPatterns.
                           super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                           .
                           super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                           .
                           super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                   + 8),0,(uint)bVar8);
        if (bVar8) {
          pSVar10 = matchit::impl::Id<mathiu::impl::Sum>::get(local_1e18);
          insertSum<mathiu::impl::Sum,std::shared_ptr<mathiu::impl::Expr_const>>
                    ((impl *)local_2230,pSVar10,local_1e10);
        }
        else {
          std::
          array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
          ::~array(&context.mMemHolder);
          memset(&context,0,0x558);
          matchit::impl::
          Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
          ::Context(&context);
          bVar8 = matchit::impl::
                  matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                            (value,&local_1520.mPatterns.
                                    super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                                    .
                                    super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                                    ._M_head_impl,1,&context);
          if (bVar8) {
            bVar8 = matchit::impl::
                    matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                              (value_00,(App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
                                         *)&local_1520,1,&context);
            IVar14 = extraout_EDX_02;
          }
          else {
            bVar8 = false;
            IVar14 = extraout_EDX_01;
          }
          matchit::impl::
          processId<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>>>
                    (&local_1520,(uint)bVar8,IVar14);
          if (bVar8 == false) {
            std::
            array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
            ::~array(&context.mMemHolder);
            memset(&context,0,0x558);
            matchit::impl::
            Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
            ::Context(&context);
            bVar8 = matchit::impl::
                    matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                              (value,&local_1b30.mPatterns.
                                      super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                                      .
                                      super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                                      ._M_head_impl,1,&context);
            if (bVar8) {
              bVar8 = matchit::impl::
                      matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                                (value_00,(App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
                                           *)&local_1b30,1,&context);
              IVar14 = extraout_EDX_04;
            }
            else {
              bVar8 = false;
              IVar14 = extraout_EDX_03;
            }
            matchit::impl::
            processId<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>>>
                      (&local_1b30,(uint)bVar8,IVar14);
            if (bVar8 == false) {
              std::
              array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
              ::~array(&context.mMemHolder);
              memset(&context,0,0x558);
              matchit::impl::
              Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
              ::Context(&context);
              bVar8 = matchit::impl::
                      matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                                (value,&local_1be8.mPatterns.
                                        super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                                        .
                                        super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                                        ._M_head_impl,1,&context);
              if (bVar8) {
                bVar8 = matchit::impl::
                        matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                                  (value_00,(App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
                                             *)&local_1be8,1,&context);
                IVar14 = extraout_EDX_06;
              }
              else {
                bVar8 = false;
                IVar14 = extraout_EDX_05;
              }
              matchit::impl::
              processId<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>>>
                        (&local_1be8,(uint)bVar8,IVar14);
              if (bVar8 == false) {
                std::
                array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
                ::~array(&context.mMemHolder);
                memset(&context,0,0x558);
                matchit::impl::
                Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                ::Context(&context);
                bVar8 = matchit::impl::
                        matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                                  (value,&local_1d48.mPatterns.
                                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                                          .
                                          super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                                          ._M_head_impl,1,&context);
                if (bVar8) {
                  bVar8 = matchit::impl::
                          matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                                    (value_00,(App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
                                               *)&local_1d48,1,&context);
                  IVar14 = extraout_EDX_08;
                }
                else {
                  bVar8 = false;
                  IVar14 = extraout_EDX_07;
                }
                matchit::impl::
                processId<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>>>
                          (&local_1d48,(uint)bVar8,IVar14);
                if (bVar8 == false) {
                  std::
                  array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
                  ::~array(&context.mMemHolder);
                  memset(&context,0,0x558);
                  matchit::impl::
                  Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                  ::Context(&context);
                  bVar8 = matchit::impl::
                          matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::PieceWise>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::PieceWise>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                                    (value,&local_1f70,1,&context);
                  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::
                  processIdImpl((InternalPatternT<matchit::impl::Id<mathiu::impl::PieceWise>_> *)
                                ((long)&local_1f70.mPattern.mPatterns.
                                        super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                        .
                                        super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                        .
                                        super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                                + 8),0,(uint)bVar8);
                  if (bVar8) {
                    pvVar12 = &matchit::impl::Id<mathiu::impl::PieceWise>::get(local_1f20)->
                               super_vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                    ;
                    std::
                    vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                    ::vector((vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                              *)local_2230,pvVar12);
                    pEVar7 = local_1f18;
                    for (; (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_2230[0].first.
                           super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr != local_2230[0].first.
                                     super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                        local_2230[0].first.
                        super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr = (element_type *)
                                 ((long)local_2230[0].first.
                                        super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 0x20)) {
                      operator+((impl *)local_21f0,
                                (ExprPtr *)
                                local_2230[0].first.
                                super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,pEVar7);
                      std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::
                      operator=((__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                 *)local_2230[0].first.
                                   super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,
                                (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                 *)local_21f0);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_21f0 + 8));
                    }
                    std::make_shared<mathiu::impl::Expr_const,mathiu::impl::PieceWise>
                              ((PieceWise *)&local_21c0);
                  }
                  else {
                    std::
                    array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
                    ::~array(&context.mMemHolder);
                    memset(&context,0,0x558);
                    matchit::impl::
                    Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                    ::Context(&context);
                    bVar8 = matchit::impl::
                            matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::PieceWise>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::PieceWise>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                                      (value_00,&local_1fd0,1,&context);
                    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::
                    processIdImpl((InternalPatternT<matchit::impl::Id<mathiu::impl::PieceWise>_> *)
                                  ((long)&local_1fd0.mPattern.mPatterns.
                                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                          .
                                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                          .
                                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                                  + 8),0,(uint)bVar8);
                    if (!bVar8) {
                      std::
                      array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
                      ::~array(&context.mMemHolder);
                      memset(&context,0,0x558);
                      matchit::impl::
                      Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                      ::Context(&context);
                      eVar9 = matchit::impl::
                              matchPattern<std::tuple<mathiu::impl::Expr_const&,mathiu::impl::Expr_const&>,matchit::impl::Ds<matchit::impl::App<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>(&)(mathiu::impl::Expr_const&),matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::App<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>(&)(mathiu::impl::Expr_const&),matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                                        ((tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>
                                          *)&stack0xffffffffffffdda8,
                                         (Ds<matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                                          *)&local_1328,0,&context);
                      if (!eVar9) {
                        std::
                        array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
                        ::~array(&context.mMemHolder);
                        memset(&context,0,0x558);
                        matchit::impl::
                        Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                        ::Context(&context);
                        coeffAndTerm(&local_21c0,
                                     (lhs->
                                     super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr);
                        std::
                        pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                        ::pair<std::shared_ptr<const_mathiu::impl::Expr>,_true>
                                  (local_2230,&local_21c0.second,lhs);
                        coeffAndTerm(&local_2040,
                                     (rhs->
                                     super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr);
                        std::
                        pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                        ::pair<std::shared_ptr<const_mathiu::impl::Expr>,_true>
                                  (local_2230 + 1,&local_2040.second,rhs);
                        __l._M_len = 2;
                        __l._M_array = local_2230;
                        std::
                        map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                        ::map((map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                               *)local_21f0,__l,&local_2231,&local_2232);
                        std::make_shared<mathiu::impl::Expr_const,mathiu::impl::Sum>
                                  ((Sum *)local_2178);
                        std::
                        _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                        ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                                     *)local_21f0);
                        lVar15 = 0x20;
                        do {
                          std::
                          pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                          ::~pair((pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                                   *)((long)&local_2230[0].first.
                                             super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + lVar15));
                          lVar15 = lVar15 + -0x20;
                        } while (lVar15 != -0x20);
                        std::
                        pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                        ::~pair(&local_2040);
                        std::
                        pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                        ::~pair(&local_21c0);
                        std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::
                        operator=(&local_2248,
                                  (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                   *)local_2178);
                        this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2178 + 8);
                        goto LAB_00165a8e;
                      }
                      psVar13 = matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::get
                                          (local_1278);
                      rhs_00 = matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::get
                                         (local_1270);
                      operator+((impl *)local_2230,psVar13,rhs_00);
                      psVar13 = matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::get
                                          (local_1268);
                      operator*((impl *)local_21f0,&local_2230[0].first,psVar13);
                      goto LAB_001661fb;
                    }
                    pvVar12 = &matchit::impl::Id<mathiu::impl::PieceWise>::get(local_1f80)->
                               super_vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                    ;
                    std::
                    vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                    ::vector((vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                              *)local_2230,pvVar12);
                    pEVar7 = local_1f78;
                    for (; (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_2230[0].first.
                           super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr != local_2230[0].first.
                                     super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                        local_2230[0].first.
                        super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr = (element_type *)
                                 ((long)local_2230[0].first.
                                        super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 0x20)) {
                      operator+((impl *)local_21f0,pEVar7,
                                (ExprPtr *)
                                local_2230[0].first.
                                super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
                      std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::
                      operator=((__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                 *)local_2230[0].first.
                                   super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,
                                (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                 *)local_21f0);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_21f0 + 8));
                    }
                    std::make_shared<mathiu::impl::Expr_const,mathiu::impl::PieceWise>
                              ((PieceWise *)&local_21c0);
                  }
                  std::
                  vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  ::~vector((vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                             *)local_2230);
                  std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
                            (&local_2248,
                             (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)
                             &local_21c0);
                  this_00 = &local_21c0.first.
                             super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount;
                  goto LAB_00165a8e;
                }
                piVar11 = matchit::impl::Id<int>::get(local_1c88);
                iVar1 = *piVar11;
                piVar11 = matchit::impl::Id<int>::get(local_1c80);
                iVar2 = *piVar11;
                piVar11 = matchit::impl::Id<int>::get(local_1c78);
                iVar3 = *piVar11;
                piVar11 = matchit::impl::Id<int>::get(local_1c70);
                iVar4 = *piVar11;
                matchit::impl::Id<int>::get(local_1c78);
                matchit::impl::Id<int>::get(local_1c80);
                fraction((Integer)local_2230,iVar3 * iVar4 + iVar1 * iVar2);
                simplifyRational((impl *)local_21f0,&local_2230[0].first);
              }
              else {
                piVar11 = matchit::impl::Id<int>::get(local_1b48);
                iVar1 = *piVar11;
                piVar11 = matchit::impl::Id<int>::get(local_1b40);
                iVar2 = *piVar11;
                piVar11 = matchit::impl::Id<int>::get(local_1b38);
                iVar3 = *piVar11;
                matchit::impl::Id<int>::get(local_1b40);
                fraction((Integer)local_2230,iVar3 + iVar2 * iVar1);
                simplifyRational((impl *)local_21f0,&local_2230[0].first);
              }
            }
            else {
              piVar11 = matchit::impl::Id<int>::get(local_1a90);
              iVar1 = *piVar11;
              piVar11 = matchit::impl::Id<int>::get(local_1a88);
              iVar2 = *piVar11;
              piVar11 = matchit::impl::Id<int>::get(local_1a80);
              iVar3 = *piVar11;
              matchit::impl::Id<int>::get(local_1a88);
              fraction((Integer)local_2230,iVar3 + iVar2 * iVar1);
              simplifyRational((impl *)local_21f0,&local_2230[0].first);
            }
LAB_001661fb:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_2230[0].first.
                        super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_2248,
                       (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)
                       local_21f0);
            this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_21f0 + 8);
            goto LAB_00165a8e;
          }
          matchit::impl::Id<int>::get(local_14a0);
          matchit::impl::Id<int>::get(local_1498);
          integer((Integer)((ulong)value_00 >> 0x20));
        }
      }
    }
    else {
      pSVar10 = matchit::impl::Id<mathiu::impl::Sum>::get(local_f00);
      c2 = matchit::impl::Id<mathiu::impl::Sum>::get(local_ef8);
      mergeSum<mathiu::impl::Sum>((impl *)local_2230,pSVar10,c2);
    }
  }
LAB_00165a84:
  std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_2248,
             (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)local_2230);
  this_00 = &local_2230[0].first.
             super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
LAB_00165a8e:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  std::
  array<std::variant<std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_34UL>
  ::~array(&context.mMemHolder);
  piVar6 = local_21a0;
  _Var5._M_pi = local_2248._M_refcount._M_pi;
  local_2248._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)local_21a0 = local_2248._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_21a0 + 8) = _Var5._M_pi;
  local_2248._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2248._M_refcount);
  std::
  _Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  ::~_Tuple_impl(&local_1328);
  std::
  _Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  ::~_Tuple_impl(&local_900);
  std::
  _Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  ::~_Tuple_impl(&local_9b0);
  std::
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                  *)&local_1080.mPattern);
  std::
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                  *)&local_1028.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)((long)&local_1fd0.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)((long)&local_11c0.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)((long)&local_1210.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)((long)&local_1260.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_1f10);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)((long)&local_1f70.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)((long)&local_10d0.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)((long)&local_1120.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)((long)&local_1170.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_1ee0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)((long)&local_1e80.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)((long)&local_e20.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)((long)&local_e88.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)((long)&local_ef0.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_1490);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)((long)&local_1e08.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)((long)&local_ce8.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)((long)&local_d50.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)((long)&local_db8.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_1448);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  ::~Ds(&local_fd0);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  ::~Ds(&local_600);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  ::~Ds(&local_6d0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)((long)&local_c80.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_1400);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)((long)&local_c18.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_13b8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)&iPieceWise);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&rest);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&coeff2);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&coeff1);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&iSr);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&iSl);
  EVar17.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  EVar17.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)piVar6;
  return (ExprPtr)EVar17.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator+(ExprPtr const &lhs, ExprPtr const &rhs)
    {
#if VERBOSE_DEBUG
        std::cout << "operator+: " << toString(lhs) << "\t" << toString(rhs) << std::endl;
#endif // VERBOSE_DEBUG
        Id<Sum> iSl, iSr;
        Id<Integer> iil, iir;
        Id<Integer> ii1, ii2, ii3, ii4;
        Id<ExprPtr> coeff1, coeff2, rest;
        Id<PieceWise> iPieceWise;
        return match(*lhs, *rhs)(
            // clang-format off
                // basic commutative transformation
                pattern | _ | when ([&]{ return less(rhs, lhs); }) = [&] {
                    return rhs + lhs;
                },
                // basic identity transformation
                pattern | ds(as<Integer>(0), _) = expr(rhs),
                pattern | ds(_, as<Integer>(0)) = expr(lhs),
                // basic associative transformation
                pattern | ds(as<Sum>(iSl), as<Sum>(iSr)) = [&] {
                    return mergeSum(*iSl, *iSr);
                },
                pattern | ds(as<Sum>(iSl), _) = [&] {
                    return insertSum(*iSl, rhs);
                },
                pattern | ds(_, as<Sum>(iSr)) = [&] {
                    return insertSum(*iSr, lhs);
                },
                // basic distributive transformation
                pattern | ds(as<Integer>(iil), as<Integer>(iir))   = [&] { return integer(*iil + *iir); },
                pattern | ds(as<Integer>(iil), as<Fraction>(ds(ii1, ii2)))   = [&] { return simplifyRational(fraction(*iil * *ii2 + *ii1, *ii2)); },
                pattern | ds(as<Fraction>(ds(ii1, ii2)), as<Integer>(iir))   = [&] { return simplifyRational(fraction(*iir * *ii2 + *ii1, *ii2)); },
                pattern | ds(as<Fraction>(ds(ii1, ii2)), as<Fraction>(ds(ii3, ii4)))   = [&] { return simplifyRational(fraction(*ii1 * *ii4 + *ii2 * *ii3, *ii2 * *ii4)); },
                // piecewise
                pattern | ds(as<PieceWise>(iPieceWise), _) = [&]
                {
                    return transformPieceWise(*iPieceWise, [&](auto&& e) { return e + rhs; });
                },
                pattern | ds(_, as<PieceWise>(iPieceWise)) = [&]
                {
                    return transformPieceWise(*iPieceWise, [&](auto&& e) { return lhs + e; });
                },
                // basic distributive transformation
                pattern | ds(asCoeffAndRest(coeff1, rest), asCoeffAndRest(coeff2, rest)) = [&]
                {
                    return ((*coeff1) + (*coeff2)) * (*rest);
                },
                pattern | _                            = [&] { return makeSharedExprPtr(Sum{{{coeffAndTerm(*lhs).second, lhs}, {coeffAndTerm(*rhs).second, rhs}}}); }
            // clang-format on
        );
    }